

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_destSize_extState
              (LZ4_stream_t *state,char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  uint uVar1;
  short sVar2;
  int iVar3;
  U16 UVar4;
  U16 UVar5;
  int iVar6;
  U32 UVar7;
  uint uVar8;
  U32 UVar9;
  U32 UVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  BYTE *pBVar15;
  reg_t rVar16;
  reg_t rVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  bool bVar20;
  tableType_t addrMode;
  void *s;
  int targetDstSize_local;
  int *srcSizePtr_local;
  char *dst_local;
  char *src_local;
  LZ4_stream_t *state_local;
  int local_fac;
  int local_f64;
  ulong local_f60;
  size_t accumulator;
  size_t lastRun;
  U32 matchIndex_1;
  U32 current_1;
  U32 h_7;
  U32 h_3;
  BYTE *ptr;
  U32 newMatchCode;
  uint more;
  BYTE *limit;
  uint matchCode;
  int len;
  uint litLength;
  U32 matchIndex;
  U32 current;
  U32 h_2;
  int searchMatchNb_1;
  int step_1;
  BYTE *forwardIp_1;
  U32 h_1;
  int searchMatchNb;
  int step;
  BYTE *forwardIp;
  BYTE *filledIp;
  BYTE *token;
  BYTE *match;
  U32 forwardH;
  U32 offset;
  BYTE *olimit;
  BYTE *op;
  BYTE *dictBase;
  BYTE *matchlimit;
  BYTE *mflimitPlusOne;
  BYTE *iend;
  BYTE *anchor;
  BYTE *dictEnd;
  U32 prefixIdxLimit;
  int maybe_extMem;
  U32 dictDelta;
  U32 dictSize;
  BYTE *dictionary;
  LZ4_stream_t_internal *dictCtx;
  BYTE *lowLimit;
  BYTE *base;
  BYTE *pBStack_e50;
  U32 startIndex;
  BYTE *ip;
  int result;
  int local_e00;
  U32 h_6;
  U32 h_4;
  U32 h;
  ulong local_d88;
  size_t accumulator_1;
  size_t lastRun_1;
  U32 matchIndex_3;
  U32 current_3;
  U32 h_15;
  U32 h_11;
  BYTE *ptr_1;
  U32 newMatchCode_1;
  uint more_1;
  BYTE *limit_1;
  uint matchCode_1;
  int len_1;
  uint litLength_1;
  U32 matchIndex_2;
  U32 current_2;
  U32 h_10;
  int searchMatchNb_3;
  int step_3;
  BYTE *forwardIp_3;
  U32 h_9;
  int searchMatchNb_2;
  int step_2;
  BYTE *forwardIp_2;
  BYTE *filledIp_1;
  BYTE *token_1;
  BYTE *match_1;
  U32 forwardH_1;
  U32 offset_1;
  BYTE *olimit_1;
  BYTE *op_1;
  BYTE *dictBase_1;
  BYTE *matchlimit_1;
  BYTE *mflimitPlusOne_1;
  BYTE *iend_1;
  BYTE *anchor_1;
  BYTE *dictEnd_1;
  U32 prefixIdxLimit_1;
  int maybe_extMem_1;
  U32 dictDelta_1;
  U32 dictSize_1;
  BYTE *dictionary_1;
  LZ4_stream_t_internal *dictCtx_1;
  BYTE *lowLimit_1;
  BYTE *base_1;
  BYTE *pBStack_c78;
  U32 startIndex_1;
  BYTE *ip_1;
  int result_1;
  int local_c28;
  U32 h_14;
  U32 h_12;
  U32 h_8;
  U16 *hashTable_32;
  U32 *hashTable_31;
  BYTE **hashTable_30;
  U16 *hashTable_47;
  U32 *hashTable_46;
  BYTE **hashTable_45;
  U16 *hashTable_44;
  U32 *hashTable_43;
  BYTE **hashTable_42;
  U16 *hashTable_29;
  U32 *hashTable_28;
  BYTE **hashTable_27;
  U16 *hashTable_5;
  U32 *hashTable_4;
  BYTE **hashTable_3;
  U16 *hashTable_20;
  U32 *hashTable_19;
  BYTE **hashTable_18;
  U16 *hashTable_17;
  U32 *hashTable_16;
  BYTE **hashTable_15;
  U16 *hashTable_2;
  U32 *hashTable_1;
  BYTE **hashTable;
  U16 *hashTable_36;
  U32 *hashTable_35;
  U16 *hashTable_51;
  U32 *hashTable_50;
  U16 *hashTable_49;
  U32 *hashTable_48;
  U16 *hashTable_34;
  U32 *hashTable_33;
  U16 *hashTable_9;
  U32 *hashTable_8;
  U16 *hashTable_24;
  U32 *hashTable_23;
  U16 *hashTable_22;
  U32 *hashTable_21;
  U16 *hashTable_7;
  U32 *hashTable_6;
  U16 *hashTable_53;
  U32 *hashTable_52;
  U16 *hashTable_38;
  U32 *hashTable_37;
  U16 *hashTable_26;
  U32 *hashTable_25;
  U16 *hashTable_11;
  U32 *hashTable_10;
  BYTE *e_1;
  BYTE *s_2;
  BYTE *d_1;
  BYTE *e;
  BYTE *s_1;
  BYTE *d;
  reg_t diff_9;
  reg_t diff_8;
  BYTE *pStart_4;
  reg_t diff_7;
  reg_t diff_6;
  BYTE *pStart_3;
  reg_t diff_11;
  reg_t diff_10;
  BYTE *pStart_5;
  BYTE *local_5b8;
  BYTE *local_5b0;
  uint local_5a4;
  reg_t diff_3;
  reg_t diff_2;
  BYTE *pStart_1;
  reg_t diff_1;
  reg_t diff;
  BYTE *pStart;
  reg_t diff_5;
  reg_t diff_4;
  BYTE *pStart_2;
  BYTE *local_510;
  BYTE *local_508;
  uint local_4fc;
  U16 *hashTable_41;
  U32 *hashTable_40;
  BYTE **hashTable_39;
  U16 *hashTable_14;
  U32 *hashTable_13;
  BYTE **hashTable_12;
  U32 h_13;
  U32 h_5;
  U64 prime8bytes_6;
  U64 prime5bytes_6;
  U32 hashLog_6;
  U64 prime8bytes_16;
  U64 prime5bytes_16;
  U32 hashLog_16;
  U64 prime8bytes;
  U64 prime5bytes;
  U32 hashLog;
  U64 prime8bytes_1;
  U64 prime5bytes_1;
  U32 hashLog_1;
  U64 prime8bytes_3;
  U64 prime5bytes_3;
  U32 hashLog_3;
  U64 prime8bytes_5;
  U64 prime5bytes_5;
  U32 hashLog_5;
  U64 prime8bytes_8;
  U64 prime5bytes_8;
  U32 hashLog_8;
  U64 prime8bytes_9;
  U64 prime5bytes_9;
  U32 hashLog_9;
  U64 prime8bytes_7;
  U64 prime5bytes_7;
  U32 hashLog_7;
  U64 prime8bytes_4;
  U64 prime5bytes_4;
  U32 hashLog_4;
  U64 prime8bytes_2;
  U64 prime5bytes_2;
  U32 hashLog_2;
  U64 prime8bytes_10;
  U64 prime5bytes_10;
  U32 hashLog_10;
  uint local_24c;
  U64 prime8bytes_11;
  U64 prime5bytes_11;
  U32 hashLog_11;
  uint local_224;
  U64 prime8bytes_13;
  U64 prime5bytes_13;
  U32 hashLog_13;
  uint local_1fc;
  U64 prime8bytes_15;
  U64 prime5bytes_15;
  U32 hashLog_15;
  uint local_1d4;
  U64 prime8bytes_18;
  U64 prime5bytes_18;
  U32 hashLog_18;
  uint local_1ac;
  U64 prime8bytes_19;
  U64 prime5bytes_19;
  U32 hashLog_19;
  uint local_184;
  U64 prime8bytes_17;
  U64 prime5bytes_17;
  U32 hashLog_17;
  U64 prime8bytes_14;
  U64 prime5bytes_14;
  U32 hashLog_14;
  uint local_134;
  U64 prime8bytes_12;
  U64 prime5bytes_12;
  U32 hashLog_12;
  
  LZ4_initStream(state,0x4020);
  iVar6 = LZ4_compressBound(*srcSizePtr);
  if (targetDstSize < iVar6) {
    iVar6 = (int)src;
    if (*srcSizePtr < 0x1000b) {
      uVar1 = *srcSizePtr;
      if (uVar1 < 0x7e000001) {
        if (uVar1 == 0) {
          if (targetDstSize < 1) {
            local_f64 = 0;
          }
          else {
            *dst = '\0';
            *srcSizePtr = 0;
            local_f64 = 1;
          }
        }
        else {
          lVar14 = (long)src - (ulong)(state->internal_donotuse).currentOffset;
          pBVar15 = (BYTE *)(dst + targetDstSize);
          if (targetDstSize < 1) {
            local_e00 = 0;
          }
          else if ((int)uVar1 < 0x1000b) {
            (state->internal_donotuse).dictSize = uVar1 + (state->internal_donotuse).dictSize;
            (state->internal_donotuse).currentOffset =
                 uVar1 + (state->internal_donotuse).currentOffset;
            (state->internal_donotuse).tableType = 3;
            olimit = (BYTE *)dst;
            iend = (BYTE *)src;
            if (0xc < (int)uVar1) {
              UVar10 = LZ4_read32(src);
              uVar8 = UVar10 * -0x61c8864f >> 0x13;
              sVar2 = (short)lVar14;
              switch(0x4fae16) {
              case 0:
                break;
              case 1:
                *(char **)((long)state + (ulong)uVar8 * 8) = src;
                break;
              case 2:
                *(int *)((long)state + (ulong)uVar8 * 4) = iVar6 - (int)lVar14;
                break;
              case 3:
                *(short *)((long)state + (ulong)uVar8 * 2) = (short)src - sVar2;
              }
              pBStack_e50 = (BYTE *)(src + 1);
              UVar10 = LZ4_read32(pBStack_e50);
LAB_004fafc3:
              _searchMatchNb_1 = pBStack_e50;
              h_2 = 1;
              current = 0x40;
              pBVar18 = _searchMatchNb_1;
              do {
                _searchMatchNb_1 = pBVar18;
                match._0_4_ = UVar10 * -0x61c8864f >> 0x13;
                pBVar18 = _searchMatchNb_1 + (int)h_2;
                h_2 = (int)current >> 6;
                if (src + (long)(int)uVar1 + -0xb < pBVar18) goto LAB_004fd7ed;
                token = (BYTE *)(lVar14 + (ulong)*(ushort *)((long)state + (ulong)(uint)match * 2));
                UVar10 = LZ4_read32(pBVar18);
                *(short *)((long)state + (ulong)(uint)match * 2) = (short)_searchMatchNb_1 - sVar2;
                UVar9 = LZ4_read32(token);
                UVar7 = LZ4_read32(_searchMatchNb_1);
                current = current + 1;
              } while (UVar9 != UVar7);
              pBStack_e50 = _searchMatchNb_1;
              while( true ) {
                bVar20 = false;
                if (iend < pBStack_e50 && src < token) {
                  bVar20 = pBStack_e50[-1] == token[-1];
                }
                if (!bVar20) break;
                pBStack_e50 = pBStack_e50 + -1;
                token = token + -1;
              }
              uVar8 = (int)pBStack_e50 - (int)iend;
              pBVar18 = olimit + 1;
              filledIp = olimit;
              if (pBVar18 + (ulong)uVar8 + (ulong)(uVar8 + 0xf0) / 0xff + 0xb <= pBVar15) {
                if (uVar8 < 0xf) {
                  *olimit = (char)uVar8 * '\x10';
                  olimit = pBVar18;
                }
                else {
                  *olimit = 0xf0;
                  olimit = pBVar18;
                  for (limit._4_4_ = uVar8 - 0xf; 0xfe < limit._4_4_;
                      limit._4_4_ = limit._4_4_ + -0xff) {
                    *olimit = 0xff;
                    olimit = olimit + 1;
                  }
                  *olimit = (BYTE)limit._4_4_;
                  olimit = olimit + 1;
                }
                s_1 = olimit;
                e = iend;
                do {
                  *(undefined8 *)s_1 = *(undefined8 *)e;
                  s_1 = s_1 + 8;
                  e = e + 8;
                } while (s_1 < olimit + uVar8);
                olimit = olimit + uVar8;
                do {
                  pBVar18 = olimit;
                  if (pBVar15 < olimit + 0xb) {
                    olimit = filledIp;
                    break;
                  }
                  LZ4_writeLE16(olimit,(short)pBStack_e50 - (short)token);
                  olimit = olimit + 2;
                  pBVar19 = pBStack_e50 + 4;
                  local_510 = token + 4;
                  local_508 = pBVar19;
                  if (pBVar19 < src + (long)(int)uVar1 + -0xc) {
                    rVar16 = LZ4_read_ARCH(local_510);
                    rVar17 = LZ4_read_ARCH(pBVar19);
                    if ((rVar16 ^ rVar17) == 0) {
                      local_510 = token + 0xc;
                      local_508 = pBStack_e50 + 0xc;
                      goto LAB_004fc38a;
                    }
                    local_4fc = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                  }
                  else {
LAB_004fc38a:
                    for (; local_508 < src + (long)(int)uVar1 + -0xc; local_508 = local_508 + 8) {
                      rVar16 = LZ4_read_ARCH(local_510);
                      rVar17 = LZ4_read_ARCH(local_508);
                      if ((rVar16 ^ rVar17) != 0) {
                        uVar8 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                        local_4fc = ((int)local_508 + uVar8) - (int)pBVar19;
                        goto LAB_004fc570;
                      }
                      local_510 = local_510 + 8;
                    }
                    if (local_508 < src + (long)(int)uVar1 + -8) {
                      UVar10 = LZ4_read32(local_510);
                      UVar9 = LZ4_read32(local_508);
                      if (UVar10 == UVar9) {
                        local_508 = local_508 + 4;
                        local_510 = local_510 + 4;
                      }
                    }
                    if (local_508 < src + (long)(int)uVar1 + -6) {
                      UVar4 = LZ4_read16(local_510);
                      UVar5 = LZ4_read16(local_508);
                      if (UVar4 == UVar5) {
                        local_508 = local_508 + 2;
                        local_510 = local_510 + 2;
                      }
                    }
                    if ((local_508 < src + (long)(int)uVar1 + -5) && (*local_510 == *local_508)) {
                      local_508 = local_508 + 1;
                    }
                    local_4fc = (int)local_508 - (int)pBVar19;
                  }
LAB_004fc570:
                  pBStack_e50 = pBStack_e50 + (ulong)local_4fc + 4;
                  limit._0_4_ = local_4fc;
                  if (pBVar15 < pBVar18 + (ulong)(local_4fc + 0xf0) / 0xff + 8) {
                    limit._0_4_ = (((int)pBVar15 - (int)olimit) + -6) * 0xff + 0xe;
                    pBStack_e50 = pBStack_e50 + -(ulong)(local_4fc - (uint)limit);
                    _h_7 = pBStack_e50;
                    if (pBStack_e50 <= _searchMatchNb_1) {
                      for (; _h_7 <= _searchMatchNb_1; _h_7 = _h_7 + 1) {
                        UVar10 = LZ4_read32(_h_7);
                        uVar8 = UVar10 * -0x61c8864f >> 0x13;
                        switch(0x4fc88e) {
                        case 0:
                          break;
                        case 1:
                          *(undefined8 *)((long)state + (ulong)uVar8 * 8) = 0;
                          break;
                        case 2:
                          *(undefined4 *)((long)state + (ulong)uVar8 * 4) = 0;
                          break;
                        case 3:
                          *(undefined2 *)((long)state + (ulong)uVar8 * 2) = 0;
                        }
                      }
                    }
                  }
                  if ((uint)limit < 0xf) {
                    *filledIp = *filledIp + (char)(uint)limit;
                  }
                  else {
                    *filledIp = *filledIp + '\x0f';
                    limit._0_4_ = (uint)limit - 0xf;
                    LZ4_write32(olimit,0xffffffff);
                    for (; 0x3fb < (uint)limit; limit._0_4_ = (uint)limit - 0x3fc) {
                      olimit = olimit + 4;
                      LZ4_write32(olimit,0xffffffff);
                    }
                    pBVar18 = olimit + (ulong)(uint)limit / 0xff;
                    olimit = pBVar18 + 1;
                    *pBVar18 = (BYTE)((ulong)(uint)limit % 0xff);
                  }
                  iend = pBStack_e50;
                  if (src + (long)(int)uVar1 + -0xb <= pBStack_e50) break;
                  pBVar18 = pBStack_e50 + -2;
                  UVar10 = LZ4_read32(pBVar18);
                  uVar8 = UVar10 * -0x61c8864f >> 0x13;
                  switch(0x4fcc51) {
                  case 0:
                    break;
                  case 1:
                    *(BYTE **)((long)state + (ulong)uVar8 * 8) = pBVar18;
                    break;
                  case 2:
                    *(int *)((long)state + (ulong)uVar8 * 4) = (int)pBVar18 - (int)lVar14;
                    break;
                  case 3:
                    *(short *)((long)state + (ulong)uVar8 * 2) = (short)pBVar18 - sVar2;
                  }
                  UVar10 = LZ4_read32(pBStack_e50);
                  uVar8 = UVar10 * -0x61c8864f >> 0x13;
                  token = (BYTE *)(lVar14 + (ulong)*(ushort *)((long)state + (ulong)uVar8 * 2));
                  *(short *)((long)state + (ulong)uVar8 * 2) = (short)pBStack_e50 - sVar2;
                  UVar10 = LZ4_read32(token);
                  UVar9 = LZ4_read32(pBStack_e50);
                  if (UVar10 != UVar9) goto LAB_004fd675;
                  filledIp = olimit;
                  *olimit = '\0';
                  olimit = olimit + 1;
                } while( true );
              }
            }
LAB_004fd7ed:
            accumulator = (size_t)(src + ((long)(int)uVar1 - (long)iend));
            if (pBVar15 < olimit + (long)(accumulator + (ulong)(accumulator + 0xf0) / 0xff + 1)) {
              accumulator = (size_t)(pBVar15 +
                                    ((-1 - (long)olimit) -
                                    ((ulong)(pBVar15 + (0xf0 - (long)olimit)) >> 8)));
            }
            if (accumulator < 0xf) {
              *olimit = (BYTE)(accumulator << 4);
              olimit = olimit + 1;
            }
            else {
              local_f60 = accumulator - 0xf;
              *olimit = 0xf0;
              pBVar15 = olimit;
              for (; olimit = pBVar15 + 1, 0xfe < local_f60; local_f60 = local_f60 - 0xff) {
                *olimit = 0xff;
                pBVar15 = olimit;
              }
              *olimit = (BYTE)local_f60;
              olimit = pBVar15 + 2;
            }
            memcpy(olimit,iend,accumulator);
            *srcSizePtr = ((int)iend + (int)accumulator) - iVar6;
            local_e00 = ((int)accumulator + (int)olimit) - (int)dst;
          }
          else {
            local_e00 = 0;
          }
          local_f64 = local_e00;
        }
      }
      else {
        local_f64 = 0;
      }
      state_local._4_4_ = local_f64;
    }
    else {
      uVar1 = *srcSizePtr;
      if (uVar1 < 0x7e000001) {
        if (uVar1 == 0) {
          if (targetDstSize < 1) {
            local_fac = 0;
          }
          else {
            *dst = '\0';
            *srcSizePtr = 0;
            local_fac = 1;
          }
        }
        else {
          lVar14 = (long)src - (ulong)(state->internal_donotuse).currentOffset;
          pBVar15 = (BYTE *)(dst + targetDstSize);
          if (targetDstSize < 1) {
            local_c28 = 0;
          }
          else {
            (state->internal_donotuse).dictSize = uVar1 + (state->internal_donotuse).dictSize;
            (state->internal_donotuse).currentOffset =
                 uVar1 + (state->internal_donotuse).currentOffset;
            (state->internal_donotuse).tableType = 2;
            olimit_1 = (BYTE *)dst;
            iend_1 = (BYTE *)src;
            if (0xc < (int)uVar1) {
              rVar16 = LZ4_read_ARCH(src);
              uVar8 = LZ4_isLittleEndian();
              if (uVar8 == 0) {
                local_24c = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
              }
              else {
                local_24c = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
              }
              local_24c = local_24c >> 0x14;
              iVar3 = (int)lVar14;
              switch(0x4fe193) {
              case 0:
                break;
              case 1:
                *(char **)((long)state + (ulong)local_24c * 8) = src;
                break;
              case 2:
                *(int *)((long)state + (ulong)local_24c * 4) = iVar6 - iVar3;
                break;
              case 3:
                *(short *)((long)state + (ulong)local_24c * 2) = (short)src - (short)lVar14;
              }
              pBStack_c78 = (BYTE *)(src + 1);
              rVar16 = LZ4_read_ARCH(pBStack_c78);
              uVar8 = LZ4_isLittleEndian();
              if (uVar8 == 0) {
                local_224 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
              }
              else {
                local_224 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
              }
              local_224 = local_224 >> 0x14;
              match_1._0_4_ = local_224;
LAB_004fe35b:
              _searchMatchNb_3 = pBStack_c78;
              h_10 = 1;
              current_2 = 0x40;
              pBVar18 = _searchMatchNb_3;
              do {
                do {
                  _searchMatchNb_3 = pBVar18;
                  uVar13 = (uint)match_1;
                  uVar11 = (int)_searchMatchNb_3 - iVar3;
                  uVar8 = *(uint *)((long)state + (ulong)(uint)match_1 * 4);
                  pBVar18 = _searchMatchNb_3 + (int)h_10;
                  UVar10 = current_2 + 1;
                  h_10 = (int)current_2 >> 6;
                  if (src + (long)(int)uVar1 + -0xb < pBVar18) goto LAB_00500ae6;
                  token_1 = (BYTE *)(lVar14 + (ulong)uVar8);
                  rVar16 = LZ4_read_ARCH(pBVar18);
                  uVar12 = LZ4_isLittleEndian();
                  if (uVar12 == 0) {
                    local_1fc = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                  }
                  else {
                    local_1fc = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
                  }
                  local_1fc = local_1fc >> 0x14;
                  match_1._0_4_ = local_1fc;
                  *(uint *)((long)state + (ulong)uVar13 * 4) = uVar11;
                  current_2 = UVar10;
                } while (uVar8 + 0xffff < uVar11);
                UVar10 = LZ4_read32(token_1);
                UVar9 = LZ4_read32(_searchMatchNb_3);
              } while (UVar10 != UVar9);
              pBStack_c78 = _searchMatchNb_3;
              while( true ) {
                bVar20 = false;
                if (iend_1 < pBStack_c78 && src < token_1) {
                  bVar20 = pBStack_c78[-1] == token_1[-1];
                }
                if (!bVar20) break;
                pBStack_c78 = pBStack_c78 + -1;
                token_1 = token_1 + -1;
              }
              uVar8 = (int)pBStack_c78 - (int)iend_1;
              pBVar18 = olimit_1 + 1;
              filledIp_1 = olimit_1;
              if (pBVar18 + (ulong)uVar8 + (ulong)(uVar8 + 0xf0) / 0xff + 0xb <= pBVar15) {
                if (uVar8 < 0xf) {
                  *olimit_1 = (char)uVar8 * '\x10';
                  olimit_1 = pBVar18;
                }
                else {
                  *olimit_1 = 0xf0;
                  olimit_1 = pBVar18;
                  for (limit_1._4_4_ = uVar8 - 0xf; 0xfe < limit_1._4_4_;
                      limit_1._4_4_ = limit_1._4_4_ + -0xff) {
                    *olimit_1 = 0xff;
                    olimit_1 = olimit_1 + 1;
                  }
                  *olimit_1 = (BYTE)limit_1._4_4_;
                  olimit_1 = olimit_1 + 1;
                }
                s_2 = olimit_1;
                e_1 = iend_1;
                do {
                  *(undefined8 *)s_2 = *(undefined8 *)e_1;
                  s_2 = s_2 + 8;
                  e_1 = e_1 + 8;
                } while (s_2 < olimit_1 + uVar8);
                olimit_1 = olimit_1 + uVar8;
                do {
                  pBVar18 = olimit_1;
                  if (pBVar15 < olimit_1 + 0xb) {
                    olimit_1 = filledIp_1;
                    break;
                  }
                  LZ4_writeLE16(olimit_1,(short)pBStack_c78 - (short)token_1);
                  olimit_1 = olimit_1 + 2;
                  pBVar19 = pBStack_c78 + 4;
                  local_5b8 = token_1 + 4;
                  local_5b0 = pBVar19;
                  if (pBVar19 < src + (long)(int)uVar1 + -0xc) {
                    rVar16 = LZ4_read_ARCH(local_5b8);
                    rVar17 = LZ4_read_ARCH(pBVar19);
                    if ((rVar16 ^ rVar17) == 0) {
                      local_5b8 = token_1 + 0xc;
                      local_5b0 = pBStack_c78 + 0xc;
                      goto LAB_004ff6fb;
                    }
                    local_5a4 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                  }
                  else {
LAB_004ff6fb:
                    for (; local_5b0 < src + (long)(int)uVar1 + -0xc; local_5b0 = local_5b0 + 8) {
                      rVar16 = LZ4_read_ARCH(local_5b8);
                      rVar17 = LZ4_read_ARCH(local_5b0);
                      if ((rVar16 ^ rVar17) != 0) {
                        uVar8 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                        local_5a4 = ((int)local_5b0 + uVar8) - (int)pBVar19;
                        goto LAB_004ff8e1;
                      }
                      local_5b8 = local_5b8 + 8;
                    }
                    if (local_5b0 < src + (long)(int)uVar1 + -8) {
                      UVar10 = LZ4_read32(local_5b8);
                      UVar9 = LZ4_read32(local_5b0);
                      if (UVar10 == UVar9) {
                        local_5b0 = local_5b0 + 4;
                        local_5b8 = local_5b8 + 4;
                      }
                    }
                    if (local_5b0 < src + (long)(int)uVar1 + -6) {
                      UVar4 = LZ4_read16(local_5b8);
                      UVar5 = LZ4_read16(local_5b0);
                      if (UVar4 == UVar5) {
                        local_5b0 = local_5b0 + 2;
                        local_5b8 = local_5b8 + 2;
                      }
                    }
                    if ((local_5b0 < src + (long)(int)uVar1 + -5) && (*local_5b8 == *local_5b0)) {
                      local_5b0 = local_5b0 + 1;
                    }
                    local_5a4 = (int)local_5b0 - (int)pBVar19;
                  }
LAB_004ff8e1:
                  pBStack_c78 = pBStack_c78 + (ulong)local_5a4 + 4;
                  limit_1._0_4_ = local_5a4;
                  if (pBVar15 < pBVar18 + (ulong)(local_5a4 + 0xf0) / 0xff + 8) {
                    limit_1._0_4_ = (((int)pBVar15 - (int)olimit_1) + -6) * 0xff + 0xe;
                    pBStack_c78 = pBStack_c78 + -(ulong)(local_5a4 - (uint)limit_1);
                    _h_15 = pBStack_c78;
                    if (pBStack_c78 <= _searchMatchNb_3) {
                      for (; _h_15 <= _searchMatchNb_3; _h_15 = _h_15 + 1) {
                        rVar16 = LZ4_read_ARCH(_h_15);
                        uVar8 = LZ4_isLittleEndian();
                        if (uVar8 == 0) {
                          local_134 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                        }
                        else {
                          local_134 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
                        }
                        local_134 = local_134 >> 0x14;
                        switch(0x4ffbc3) {
                        case 0:
                          break;
                        case 1:
                          *(undefined8 *)((long)state + (ulong)local_134 * 8) = 0;
                          break;
                        case 2:
                          *(undefined4 *)((long)state + (ulong)local_134 * 4) = 0;
                          break;
                        case 3:
                          *(undefined2 *)((long)state + (ulong)local_134 * 2) = 0;
                        }
                      }
                    }
                  }
                  if ((uint)limit_1 < 0xf) {
                    *filledIp_1 = *filledIp_1 + (char)(uint)limit_1;
                  }
                  else {
                    *filledIp_1 = *filledIp_1 + '\x0f';
                    limit_1._0_4_ = (uint)limit_1 - 0xf;
                    LZ4_write32(olimit_1,0xffffffff);
                    for (; 0x3fb < (uint)limit_1; limit_1._0_4_ = (uint)limit_1 - 0x3fc) {
                      olimit_1 = olimit_1 + 4;
                      LZ4_write32(olimit_1,0xffffffff);
                    }
                    pBVar18 = olimit_1 + (ulong)(uint)limit_1 / 0xff;
                    olimit_1 = pBVar18 + 1;
                    *pBVar18 = (BYTE)((ulong)(uint)limit_1 % 0xff);
                  }
                  iend_1 = pBStack_c78;
                  if (src + (long)(int)uVar1 + -0xb <= pBStack_c78) break;
                  pBVar18 = pBStack_c78 + -2;
                  rVar16 = LZ4_read_ARCH(pBVar18);
                  uVar8 = LZ4_isLittleEndian();
                  if (uVar8 == 0) {
                    local_1d4 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                  }
                  else {
                    local_1d4 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
                  }
                  local_1d4 = local_1d4 >> 0x14;
                  switch(0x4fff5f) {
                  case 0:
                    break;
                  case 1:
                    *(BYTE **)((long)state + (ulong)local_1d4 * 8) = pBVar18;
                    break;
                  case 2:
                    *(int *)((long)state + (ulong)local_1d4 * 4) = (int)pBVar18 - iVar3;
                    break;
                  case 3:
                    *(short *)((long)state + (ulong)local_1d4 * 2) = (short)pBVar18 - (short)lVar14;
                  }
                  rVar16 = LZ4_read_ARCH(pBStack_c78);
                  uVar8 = LZ4_isLittleEndian();
                  if (uVar8 == 0) {
                    local_1ac = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                  }
                  else {
                    local_1ac = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
                  }
                  local_1ac = local_1ac >> 0x14;
                  uVar13 = (int)pBStack_c78 - iVar3;
                  uVar8 = *(uint *)((long)state + (ulong)local_1ac * 4);
                  token_1 = (BYTE *)(lVar14 + (ulong)uVar8);
                  *(uint *)((long)state + (ulong)local_1ac * 4) = uVar13;
                  if (uVar8 + 0xffff < uVar13) goto LAB_00500986;
                  UVar10 = LZ4_read32(token_1);
                  UVar9 = LZ4_read32(pBStack_c78);
                  if (UVar10 != UVar9) goto LAB_00500986;
                  filledIp_1 = olimit_1;
                  *olimit_1 = '\0';
                  olimit_1 = olimit_1 + 1;
                } while( true );
              }
            }
LAB_00500ae6:
            accumulator_1 = (size_t)(src + ((long)(int)uVar1 - (long)iend_1));
            if (pBVar15 < olimit_1 +
                          (long)(accumulator_1 + (ulong)(accumulator_1 + 0xf0) / 0xff + 1)) {
              accumulator_1 =
                   (size_t)(pBVar15 +
                           ((-1 - (long)olimit_1) -
                           ((ulong)(pBVar15 + (0xf0 - (long)olimit_1)) >> 8)));
            }
            if (accumulator_1 < 0xf) {
              *olimit_1 = (BYTE)(accumulator_1 << 4);
              olimit_1 = olimit_1 + 1;
            }
            else {
              local_d88 = accumulator_1 - 0xf;
              *olimit_1 = 0xf0;
              pBVar15 = olimit_1;
              for (; olimit_1 = pBVar15 + 1, 0xfe < local_d88; local_d88 = local_d88 - 0xff) {
                *olimit_1 = 0xff;
                pBVar15 = olimit_1;
              }
              *olimit_1 = (BYTE)local_d88;
              olimit_1 = pBVar15 + 2;
            }
            memcpy(olimit_1,iend_1,accumulator_1);
            *srcSizePtr = ((int)iend_1 + (int)accumulator_1) - iVar6;
            local_c28 = ((int)accumulator_1 + (int)olimit_1) - (int)dst;
          }
          local_fac = local_c28;
        }
      }
      else {
        local_fac = 0;
      }
      state_local._4_4_ = local_fac;
    }
  }
  else {
    state_local._4_4_ = LZ4_compress_fast_extState(state,src,dst,*srcSizePtr,targetDstSize,1);
  }
  return state_local._4_4_;
LAB_00500986:
  pBStack_c78 = pBStack_c78 + 1;
  rVar16 = LZ4_read_ARCH(pBStack_c78);
  uVar8 = LZ4_isLittleEndian();
  if (uVar8 == 0) {
    local_184 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_184 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
  }
  local_184 = local_184 >> 0x14;
  match_1._0_4_ = local_184;
  goto LAB_004fe35b;
LAB_004fd675:
  pBStack_e50 = pBStack_e50 + 1;
  UVar10 = LZ4_read32(pBStack_e50);
  goto LAB_004fafc3;
}

Assistant:

static int LZ4_compress_destSize_extState (LZ4_stream_t* state, const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
    void* const s = LZ4_initStream(state, sizeof (*state));
    assert(s != NULL); (void)s;

    if (targetDstSize >= LZ4_compressBound(*srcSizePtr)) {  /* compression success is guaranteed */
        return LZ4_compress_fast_extState(state, src, dst, *srcSizePtr, targetDstSize, 1);
    } else {
        if (*srcSizePtr < LZ4_64Klimit) {
            return LZ4_compress_generic(&state->internal_donotuse, src, dst, *srcSizePtr, srcSizePtr, targetDstSize, fillOutput, byU16, noDict, noDictIssue, 1);
        } else {
            tableType_t const addrMode = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(&state->internal_donotuse, src, dst, *srcSizePtr, srcSizePtr, targetDstSize, fillOutput, addrMode, noDict, noDictIssue, 1);
    }   }
}